

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keywords.cpp
# Opt level: O0

SyntaxKind psy::C::Lexer::translate(char *s,int n,ParseOptions *opts)

{
  ParseOptions *opts_local;
  int n_local;
  char *s_local;
  
  switch(n) {
  case 2:
    s_local._6_2_ = translate2(s);
    break;
  case 3:
    s_local._6_2_ = translate3(s);
    break;
  default:
    s_local._6_2_ = IdentifierToken;
    break;
  case 5:
    s_local._6_2_ = translate5(s);
    break;
  case 6:
    s_local._6_2_ = translate6(s);
  }
  return s_local._6_2_;
}

Assistant:

SyntaxKind Lexer::translate(const char* s, int n, const ParseOptions& opts)
{
    switch (n) {
        case 2: return translate2(s);
        case 3: return translate3(s);
        case 5: return translate5(s);
        case 6: return translate6(s);
        default: return SyntaxKind::IdentifierToken;
    }
}